

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::TSPI_PDU::SetSystemSpecificData(TSPI_PDU *this,vector<char,_std::allocator<char>_> *SSD)

{
  size_type sVar1;
  vector<char,_std::allocator<char>_> *SSD_local;
  TSPI_PDU *this_local;
  
  ClearSystemSpecificData(this);
  SetSystemSpecificDataFlag(this,true);
  std::vector<char,_std::allocator<char>_>::operator=(&this->m_vSSD,SSD);
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vSSD);
  this->m_ui8SSDLen = (KUINT8)sVar1;
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->m_vSSD);
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + (short)sVar1;
  return;
}

Assistant:

void TSPI_PDU::SetSystemSpecificData( const std::vector<KOCTET> & SSD )
{
    ClearSystemSpecificData();
    SetSystemSpecificDataFlag( true );
    m_vSSD = SSD;
    m_ui8SSDLen = m_vSSD.size();

    // Set the new pdu length
    m_ui16PDULength += m_vSSD.size();
}